

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_internal_cleanup_file(mcpl_fileinternal_t *f)

{
  long *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint local_14;
  uint local_10;
  uint local_c;
  
  if (in_RDI != (long *)0x0) {
    if (in_RDI[2] != 0) {
      free((void *)in_RDI[2]);
      in_RDI[2] = 0;
    }
    if (in_RDI[10] != 0) {
      for (local_c = 0; local_c < *(uint *)(in_RDI + 9); local_c = local_c + 1) {
        if (*(long *)(in_RDI[10] + (ulong)local_c * 8) != 0) {
          free(*(void **)(in_RDI[10] + (ulong)local_c * 8));
          *(undefined8 *)(in_RDI[10] + (ulong)local_c * 8) = 0;
        }
      }
      free((void *)in_RDI[10]);
      in_RDI[10] = 0;
    }
    if (in_RDI[0xc] != 0) {
      for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0xb); local_10 = local_10 + 1) {
        if (*(long *)(in_RDI[0xc] + (ulong)local_10 * 8) != 0) {
          free(*(void **)(in_RDI[0xc] + (ulong)local_10 * 8));
          *(undefined8 *)(in_RDI[0xc] + (ulong)local_10 * 8) = 0;
        }
      }
      free((void *)in_RDI[0xc]);
      in_RDI[0xc] = 0;
    }
    if (in_RDI[0xe] != 0) {
      for (local_14 = 0; local_14 < *(uint *)(in_RDI + 0xb); local_14 = local_14 + 1) {
        if (*(long *)(in_RDI[0xe] + (ulong)local_14 * 8) != 0) {
          free(*(void **)(in_RDI[0xe] + (ulong)local_14 * 8));
          *(undefined8 *)(in_RDI[0xe] + (ulong)local_14 * 8) = 0;
        }
      }
      free((void *)in_RDI[0xe]);
      in_RDI[0xe] = 0;
    }
    if (in_RDI[0xd] != 0) {
      free((void *)in_RDI[0xd]);
      in_RDI[0xd] = 0;
    }
    if (in_RDI[0x12] != 0) {
      free((void *)in_RDI[0x12]);
      in_RDI[0x12] = 0;
    }
    if (in_RDI[1] != 0) {
      gzclose(in_RDI[1]);
      in_RDI[1] = 0;
    }
    if (*in_RDI != 0) {
      fclose((FILE *)*in_RDI);
      *in_RDI = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_internal_cleanup_file(mcpl_fileinternal_t * f)
{
  if (!f)
    return;
  if ( f->hdr_srcprogname ) {
    free(f->hdr_srcprogname);
    f->hdr_srcprogname = NULL;
  }
  if ( f->comments ) {
    uint32_t i;
    for (i = 0; i < f->ncomments; ++i) {
      if ( f->comments[i] ) {
        free(f->comments[i]);
        f->comments[i] = NULL;
      }
    }
    free(f->comments);
    f->comments = NULL;
  }
  if ( f->blobkeys ) {
    for ( uint32_t i = 0; i < f->nblobs; ++i ) {
      if ( f->blobkeys[i] ) {
        free(f->blobkeys[i]);
        f->blobkeys[i] = NULL;
      }
    }
    free(f->blobkeys);
    f->blobkeys = NULL;
  }
  if ( f->blobs ) {
    for ( uint32_t i = 0; i < f->nblobs; ++i ) {
      if ( f->blobs[i] ) {
        free(f->blobs[i]);
        f->blobs[i] = NULL;
      }
    }
    free(f->blobs);
    f->blobs = NULL;
  }

  if ( f->bloblengths ) {
    free(f->bloblengths);
    f->bloblengths = NULL;
  }
  if ( f->particle ) {
    free(f->particle);
    f->particle = NULL;
  }
  if (f->filegz) {
    gzclose(f->filegz);
    f->filegz = NULL;
  }
  if (f->file) {
    fclose(f->file);
    f->file = NULL;
  }
  free(f);
}